

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O1

int IPdr_ManSolve(Aig_Man_t *pAig,Pdr_Par_t *pPars)

{
  int iVar1;
  int iVar2;
  Pdr_Man_t *p;
  Vec_Vec_t *vClauses;
  Vec_Int_t *pVVar3;
  char *pcVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  char *pcVar8;
  timespec ts;
  timespec local_48;
  long local_38;
  
  iVar2 = 3;
  iVar1 = clock_gettime(3,&local_48);
  if (iVar1 < 0) {
    lVar5 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar5 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  if ((pPars->nTimeOutOne != 0) && (pPars->fSolveAll == 0)) {
    pPars->nTimeOutOne = 0;
  }
  if ((pPars->nTimeOutOne != 0) && (pPars->nTimeOut == 0)) {
    iVar1 = pPars->nTimeOutOne * pAig->nTruePos;
    pPars->nTimeOut = (uint)(0 < iVar1 % 1000) + iVar1 / 1000;
  }
  if (pPars->fVerbose != 0) {
    Abc_Print(iVar2,"VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
              (ulong)(uint)pPars->nRecycle,(ulong)(uint)pPars->nFrameMax,
              (ulong)(uint)pPars->nRestLimit,(ulong)(uint)pPars->nTimeOut);
    pcVar8 = "yes";
    pcVar6 = "yes";
    if (pPars->fMonoCnf == 0) {
      pcVar6 = "no";
    }
    pcVar4 = "yes";
    if (pPars->fSkipGeneral == 0) {
      pcVar4 = "no";
    }
    if (pPars->fSolveAll == 0) {
      pcVar8 = "no";
    }
    Abc_Print(iVar2,"MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",pcVar6,pcVar4,pcVar8);
  }
  if (pAig->pSeqModel != (Abc_Cex_t *)0x0) {
    free(pAig->pSeqModel);
    pAig->pSeqModel = (Abc_Cex_t *)0x0;
  }
  p = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
  while( true ) {
    iVar1 = IPdr_ManSolveInt(p,1,0);
    if ((iVar1 != -1) || (pPars->iFrame != pPars->nFrameMax)) break;
    vClauses = IPdr_ManSaveClauses(p,1);
    Pdr_ManStop(p);
    p = Pdr_ManStart(pAig,pPars,(Vec_Int_t *)0x0);
    IPdr_ManRestoreClauses(p,vClauses,(Vec_Int_t *)0x0);
    pPars->nFrameMax = pPars->nFrameMax << 1;
  }
  if ((iVar1 == 0) && ((pAig->pSeqModel == (Abc_Cex_t *)0x0 && (p->vCexes == (Vec_Ptr_t *)0x0)))) {
    __assert_fail("pAig->pSeqModel != NULL || p->vCexes != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                  ,0x345,"int IPdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
  }
  if (p->vCexes != (Vec_Ptr_t *)0x0) {
    if (p->pAig->vSeqModelVec != (Vec_Ptr_t *)0x0) {
      __assert_fail("p->pAig->vSeqModelVec == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                    ,0x348,"int IPdr_ManSolve(Aig_Man_t *, Pdr_Par_t *)");
    }
    p->pAig->vSeqModelVec = p->vCexes;
    p->vCexes = (Vec_Ptr_t *)0x0;
  }
  if (p->pPars->fDumpInv == 0) {
    if (iVar1 == 1) {
      pVVar3 = Pdr_ManDeriveInfinityClauses(p,0);
      Abc_FrameSetInv(pVVar3);
    }
  }
  else {
    pcVar6 = pPars->pInvFileName;
    local_38 = lVar5;
    if (pcVar6 == (char *)0x0) {
      pcVar6 = Extra_FileNameGenericAppend(p->pAig->pName,"_inv.pla");
    }
    pVVar3 = Pdr_ManDeriveInfinityClauses(p,(uint)(iVar1 != 1));
    Abc_FrameSetInv(pVVar3);
    Pdr_ManDumpClauses(p,pcVar6,(uint)(iVar1 == 1));
    lVar5 = local_38;
  }
  iVar2 = clock_gettime(3,&local_48);
  if (iVar2 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  p->tTotal = p->tTotal + lVar7 + lVar5;
  Pdr_ManStop(p);
  pPars->iFrame = pPars->iFrame + -1;
  pVVar3 = pPars->vOutMap;
  if ((pVVar3 != (Vec_Int_t *)0x0) && (0 < pAig->nTruePos)) {
    lVar5 = 0;
    do {
      if (pVVar3->nSize <= lVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pVVar3->pArray[lVar5] == -2) {
        pVVar3->pArray[lVar5] = -1;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < pAig->nTruePos);
  }
  if (pPars->fUseBridge != 0) {
    Gia_ManToBridgeAbort(_stdout,7,(uchar *)"timeout");
  }
  return iVar1;
}

Assistant:

int IPdr_ManSolve( Aig_Man_t * pAig, Pdr_Par_t * pPars )
{
    Pdr_Man_t * p;
    int k, RetValue;
    Vec_Vec_t * vClausesSaved;

    abctime clk = Abc_Clock();
    if ( pPars->nTimeOutOne && !pPars->fSolveAll )
        pPars->nTimeOutOne = 0;
    if ( pPars->nTimeOutOne && pPars->nTimeOut == 0 )
        pPars->nTimeOut = pPars->nTimeOutOne * Saig_ManPoNum(pAig) / 1000 + (int)((pPars->nTimeOutOne * Saig_ManPoNum(pAig) % 1000) > 0);
    if ( pPars->fVerbose )
    {
//    Abc_Print( 1, "Running PDR by Niklas Een (aka IC3 by Aaron Bradley) with these parameters:\n" );
        Abc_Print( 1, "VarMax = %d. FrameMax = %d. QueMax = %d. TimeMax = %d. ",
            pPars->nRecycle,
            pPars->nFrameMax,
            pPars->nRestLimit,
            pPars->nTimeOut );
        Abc_Print( 1, "MonoCNF = %s. SkipGen = %s. SolveAll = %s.\n",
            pPars->fMonoCnf ?     "yes" : "no",
            pPars->fSkipGeneral ? "yes" : "no",
            pPars->fSolveAll ?    "yes" : "no" );
    }
    ABC_FREE( pAig->pSeqModel );


    p = Pdr_ManStart( pAig, pPars, NULL );
    while ( 1 ) {
        RetValue = IPdr_ManSolveInt( p, 1, 0 );

        if ( RetValue == -1 && pPars->iFrame == pPars->nFrameMax) {
            vClausesSaved = IPdr_ManSaveClauses( p, 1 );

            Pdr_ManStop( p );

            p = Pdr_ManStart( pAig, pPars, NULL );
            IPdr_ManRestoreClauses( p, vClausesSaved, NULL );

            pPars->nFrameMax = pPars->nFrameMax << 1;

            continue;
        }

        if ( RetValue == 0 )
            assert( pAig->pSeqModel != NULL || p->vCexes != NULL );
        if ( p->vCexes )
        {
            assert( p->pAig->vSeqModelVec == NULL );
            p->pAig->vSeqModelVec = p->vCexes;
            p->vCexes = NULL;
        }
        if ( p->pPars->fDumpInv )
        {
            char * pFileName = pPars->pInvFileName ? pPars->pInvFileName : Extra_FileNameGenericAppend(p->pAig->pName, "_inv.pla");
                Abc_FrameSetInv( Pdr_ManDeriveInfinityClauses( p, RetValue!=1 ) );
                Pdr_ManDumpClauses( p, pFileName, RetValue==1 );
        }
        else if ( RetValue == 1 )
            Abc_FrameSetInv( Pdr_ManDeriveInfinityClauses( p, RetValue!=1 ) );

        p->tTotal += Abc_Clock() - clk;
        Pdr_ManStop( p );

        break;
    }
    
    
    pPars->iFrame--;
    // convert all -2 (unknown) entries into -1 (undec)
    if ( pPars->vOutMap )
        for ( k = 0; k < Saig_ManPoNum(pAig); k++ )
            if ( Vec_IntEntry(pPars->vOutMap, k) == -2 ) // unknown
                Vec_IntWriteEntry( pPars->vOutMap, k, -1 ); // undec
    if ( pPars->fUseBridge )
        Gia_ManToBridgeAbort( stdout, 7, (unsigned char *)"timeout" );
    return RetValue;
}